

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

void linear_free_parent(void *ptr)

{
  void *pvVar1;
  void *ptr_1;
  linear_header *node;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    ptr_1 = (void *)((long)ptr + -0x38);
    if (*ptr_1 != -0x7846382d) {
      __assert_fail("node->magic == LMAGIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                    ,0x2e1,"void linear_free_parent(void *)");
    }
    while (ptr_1 != (void *)0x0) {
      pvVar1 = *(void **)((long)ptr_1 + 0x18);
      ralloc_free(ptr_1);
      ptr_1 = pvVar1;
    }
  }
  return;
}

Assistant:

void
linear_free_parent(void *ptr)
{
   linear_header *node;

   if (unlikely(!ptr))
      return;

   node = LINEAR_PARENT_TO_HEADER(ptr);
   assert(node->magic == LMAGIC);

   while (node) {
      void *ptr = node;

      node = node->next;
      ralloc_free(ptr);
   }
}